

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

void __thiscall gl3cts::PerVertexValidationTest::destroyPOsAndSOs(PerVertexValidationTest *this)

{
  GLuint *pGVar1;
  int iVar2;
  undefined4 extraout_var;
  uint n_po_id;
  long lVar3;
  GLuint *so_id_ptrs [5];
  GLuint *po_id_ptrs [5];
  GLuint *local_78 [6];
  GLuint *local_48 [6];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_48[0] = &this->m_fs_po_id;
  local_48[1] = &this->m_gs_po_id;
  local_48[2] = &this->m_tc_po_id;
  local_48[3] = &this->m_te_po_id;
  local_48[4] = &this->m_vs_po_id;
  local_78[0] = &this->m_fs_id;
  local_78[1] = &this->m_gs_id;
  local_78[2] = &this->m_tc_id;
  local_78[3] = &this->m_te_id;
  local_78[4] = &this->m_vs_id;
  for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
    pGVar1 = local_48[lVar3];
    if (*pGVar1 != 0) {
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0x448))();
      *pGVar1 = 0;
    }
  }
  for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
    pGVar1 = local_78[lVar3];
    if (*pGVar1 != 0) {
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0x470))();
      *pGVar1 = 0;
    }
  }
  return;
}

Assistant:

void PerVertexValidationTest::destroyPOsAndSOs()
{
	const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();
	glw::GLuint*		  po_id_ptrs[] = { &m_fs_po_id, &m_gs_po_id, &m_tc_po_id, &m_te_po_id, &m_vs_po_id };
	glw::GLuint*		  so_id_ptrs[] = { &m_fs_id, &m_gs_id, &m_tc_id, &m_te_id, &m_vs_id };
	const unsigned int	n_po_id_ptrs = static_cast<const unsigned int>(sizeof(po_id_ptrs) / sizeof(po_id_ptrs[0]));
	const unsigned int	n_so_id_ptrs = static_cast<const unsigned int>(sizeof(so_id_ptrs) / sizeof(so_id_ptrs[0]));

	for (unsigned int n_po_id = 0; n_po_id < n_po_id_ptrs; ++n_po_id)
	{
		glw::GLuint* po_id_ptr = po_id_ptrs[n_po_id];

		if (*po_id_ptr != 0)
		{
			gl.deleteProgram(*po_id_ptr);

			*po_id_ptr = 0;
		}
	} /* for (all shader program object ids) */

	for (unsigned int n_so_id = 0; n_so_id < n_so_id_ptrs; ++n_so_id)
	{
		glw::GLuint* so_id_ptr = so_id_ptrs[n_so_id];

		if (*so_id_ptr != 0)
		{
			gl.deleteShader(*so_id_ptr);

			*so_id_ptr = 0;
		}
	} /* for (all shader object ids) */
}